

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdPath.c
# Opt level: O0

void Sbc_ManCriticalPath_rec
               (Gia_Man_t *p,int *pLevels,int iObj,int LevelFan,Vec_Bit_t *vPath,int Slack)

{
  int LevelFan_00;
  Tim_Man_t *p_00;
  int iVar1;
  int iVar2;
  int iVar3;
  int Slack_00;
  Gia_Obj_t *pGVar4;
  int *piVar5;
  int local_68;
  int iDriver;
  Gia_Obj_t *pCo;
  int nBoxInputs;
  int curCo;
  int iBox;
  Tim_Man_t *pManTime;
  int iFan;
  int k;
  Gia_Obj_t *pObj;
  int Slack_local;
  Vec_Bit_t *vPath_local;
  int LevelFan_local;
  int iObj_local;
  int *pLevels_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjIsTravIdCurrentId(p,iObj);
  if (iVar1 == 0) {
    Gia_ObjSetTravIdCurrentId(p,iObj);
    pGVar4 = Gia_ManObj(p,iObj);
    Vec_BitWriteEntry(vPath,iObj,1);
    iVar1 = Gia_ObjIsCi(pGVar4);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsAnd(pGVar4);
      if (iVar1 == 0) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdPath.c"
                      ,0x72,
                      "void Sbc_ManCriticalPath_rec(Gia_Man_t *, int *, int, int, Vec_Bit_t *, int)"
                     );
      }
      for (pManTime._4_4_ = 0; iVar1 = Gia_ObjLutSize(p,iObj), pManTime._4_4_ < iVar1;
          pManTime._4_4_ = pManTime._4_4_ + 1) {
        piVar5 = Gia_ObjLutFanins(p,iObj);
        iVar1 = piVar5[pManTime._4_4_];
        if (LevelFan + -1 <= pLevels[iVar1] + Slack) {
          iVar2 = pLevels[iVar1];
          iVar3 = Abc_MaxInt(0,(pLevels[iVar1] + Slack) - (LevelFan + -1));
          Sbc_ManCriticalPath_rec(p,pLevels,iVar1,iVar2,vPath,iVar3);
        }
      }
    }
    else {
      p_00 = (Tim_Man_t *)p->pManTime;
      if (p_00 == (Tim_Man_t *)0x0) {
        local_68 = -1;
      }
      else {
        iVar1 = Gia_ObjCioId(pGVar4);
        local_68 = Tim_ManBoxForCi(p_00,iVar1);
      }
      if (-1 < local_68) {
        iVar1 = Tim_ManBoxInputFirst(p_00,local_68);
        iVar2 = Tim_ManBoxInputNum(p_00,local_68);
        for (pManTime._4_4_ = 0; pManTime._4_4_ < iVar2; pManTime._4_4_ = pManTime._4_4_ + 1) {
          pGVar4 = Gia_ManCo(p,iVar1 + pManTime._4_4_);
          iVar3 = Gia_ObjFaninId0p(p,pGVar4);
          if ((LevelFan + -1 <= pLevels[iVar3] + Slack) && (iVar3 != 0)) {
            LevelFan_00 = pLevels[iVar3];
            Slack_00 = Abc_MaxInt(0,(pLevels[iVar3] + Slack) - (LevelFan + -1));
            Sbc_ManCriticalPath_rec(p,pLevels,iVar3,LevelFan_00,vPath,Slack_00);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Sbc_ManCriticalPath_rec( Gia_Man_t * p, int * pLevels, int iObj, int LevelFan, Vec_Bit_t * vPath, int Slack )
{
    Gia_Obj_t * pObj; int k, iFan;
    if ( Gia_ObjIsTravIdCurrentId(p, iObj) )
        return;
    Gia_ObjSetTravIdCurrentId(p, iObj);
    pObj = Gia_ManObj( p, iObj );
    Vec_BitWriteEntry( vPath, iObj, 1 );
    if ( Gia_ObjIsCi(pObj) )
    {
        Tim_Man_t * pManTime = (Tim_Man_t *)p->pManTime;
        int iBox = pManTime ? Tim_ManBoxForCi( pManTime, Gia_ObjCioId(pObj) ) : -1;
        if ( iBox >= 0 )
        {
            int curCo = Tim_ManBoxInputFirst( pManTime, iBox );
            int nBoxInputs = Tim_ManBoxInputNum( pManTime, iBox );
            for ( k = 0; k < nBoxInputs; k++ )
            {
                Gia_Obj_t * pCo = Gia_ManCo( p, curCo + k );
                int iDriver = Gia_ObjFaninId0p( p, pCo );
                if ( (pLevels[iDriver]+Slack >= LevelFan-1) && iDriver )
                    Sbc_ManCriticalPath_rec( p, pLevels, iDriver, pLevels[iDriver], vPath, Abc_MaxInt(0, pLevels[iDriver]+Slack-(LevelFan-1)) );
            }
        }
        return;
    }
    assert( Gia_ObjIsAnd(pObj) );
    Gia_LutForEachFanin( p, iObj, iFan, k )
        if ( pLevels[iFan]+Slack >= LevelFan-1 )
            Sbc_ManCriticalPath_rec( p, pLevels, iFan, pLevels[iFan], vPath, Abc_MaxInt(0, pLevels[iFan]+Slack-(LevelFan-1)) );
}